

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compat.c
# Opt level: O0

void interleave_buffer(void *dest,void *src,size_t n,int wordsize)

{
  size_t j;
  size_t i;
  uchar *dest8;
  uchar *src8;
  int wordsize_local;
  size_t n_local;
  void *src_local;
  void *dest_local;
  
  for (i = 0; i < n / (ulong)(long)wordsize; i = i + 1) {
    for (j = 0; j < (ulong)(long)wordsize; j = j + 1) {
      *(undefined1 *)((long)dest + j * (n / (ulong)(long)wordsize) + i) =
           *(undefined1 *)((long)src + i * (long)wordsize + j);
    }
  }
  return;
}

Assistant:

static void interleave_buffer(void *dest, const void *src,
                              size_t n, int wordsize)
{
    const unsigned char *src8 = (unsigned char *)src;
    unsigned char *dest8 = (unsigned char *)dest;

    for (size_t i = 0; i < n / wordsize; i++)
        for (size_t j = 0; j < wordsize; j++)
            dest8[j * (n / wordsize) + i] = src8[i * wordsize + j];
}